

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::io::Printer::ValidateIndexLookupInBounds(unsigned_long,unsigned_long,unsigned_long,google::protobuf::io::Printer::PrintOptions)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  size_type in_R9;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  UntypedFormatSpecImpl format;
  ulong local_38;
  code *local_30;
  long local_28;
  code *local_20;
  ulong local_18;
  code *local_10;
  
  local_38 = (ulong)*(byte *)(*(long *)this + 0x28);
  local_28 = *(long *)(this + 8) + 1;
  local_30 = str_format_internal::FormatArgImpl::Dispatch<char>;
  local_20 = str_format_internal::FormatArgImpl::Dispatch<unsigned_long>;
  local_10 = str_format_internal::FormatArgImpl::Dispatch<char>;
  args.len_ = in_R9;
  args.ptr_ = (pointer)0x3;
  format.size_ = (size_t)&local_38;
  format.data_ = (void *)0x23;
  local_18 = local_38;
  str_format_internal::FormatPack_abi_cxx11_
            (__return_storage_ptr__,(str_format_internal *)"annotation %c{%d%c is out of bounds",
             format,args);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}